

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int m_eq_1(char *z)

{
  int iVar1;
  char *in_RDI;
  char *in_stack_ffffffffffffffe8;
  char *local_10;
  uint local_4;
  
  local_10 = in_RDI;
  while (iVar1 = isVowel(in_stack_ffffffffffffffe8), iVar1 != 0) {
    local_10 = local_10 + 1;
  }
  if (*local_10 == '\0') {
    local_4 = 0;
  }
  else {
    while (iVar1 = isConsonant(in_stack_ffffffffffffffe8), iVar1 != 0) {
      local_10 = local_10 + 1;
    }
    if (*local_10 == '\0') {
      local_4 = 0;
    }
    else {
      while (iVar1 = isVowel(in_stack_ffffffffffffffe8), iVar1 != 0) {
        local_10 = local_10 + 1;
      }
      if (*local_10 == '\0') {
        local_4 = 1;
      }
      else {
        while (iVar1 = isConsonant(in_stack_ffffffffffffffe8), iVar1 != 0) {
          local_10 = local_10 + 1;
        }
        local_4 = (uint)(*local_10 == '\0');
      }
    }
  }
  return local_4;
}

Assistant:

static int m_eq_1(const char *z){
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 1;
  while( isConsonant(z) ){ z++; }
  return *z==0;
}